

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

void Gia_ManPrintReached(char *pStr,int iState,Vec_Int_t *vReached)

{
  int iVar1;
  uint uVar2;
  int local_24;
  int Entry;
  int i;
  Vec_Int_t *vReached_local;
  int iState_local;
  char *pStr_local;
  
  printf("Reached from state %d \'%c\':  ",(ulong)(uint)iState,(ulong)(uint)(int)pStr[iState]);
  for (local_24 = 0; iVar1 = Vec_IntSize(vReached), local_24 < iVar1; local_24 = local_24 + 1) {
    uVar2 = Vec_IntEntry(vReached,local_24);
    printf("%d \'%c\'  ",(ulong)uVar2,(ulong)(uint)(int)pStr[(int)uVar2]);
  }
  printf("\n");
  return;
}

Assistant:

void Gia_ManPrintReached( char * pStr, int iState, Vec_Int_t * vReached )
{
    int i, Entry;
    printf( "Reached from state %d \'%c\':  ", iState, pStr[iState] );
    Vec_IntForEachEntry( vReached, Entry, i )
        printf( "%d \'%c\'  ", Entry, pStr[Entry] );
    printf( "\n" );
}